

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O1

bool __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::parseCDATA
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this)

{
  char cVar1;
  char *pcVar2;
  char cVar3;
  uint uVar4;
  char *pcVar5;
  char *c;
  bool bVar6;
  bool bVar7;
  string<char> local_28;
  
  cVar1 = this->P[1];
  if (cVar1 == '[') {
    this->CurrentNodeType = EXN_CDATA;
    c = this->P;
    bVar7 = *c == '\0';
    if (!bVar7) {
      uVar4 = 0;
      do {
        c = c + 1;
        this->P = c;
        bVar7 = *c == '\0';
        if (bVar7) break;
        bVar6 = uVar4 < 7;
        uVar4 = uVar4 + 1;
      } while (bVar6);
    }
    if (!bVar7) {
      cVar3 = *this->P;
      if (cVar3 == '\0') {
        bVar7 = true;
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar2 = this->P + -2;
        pcVar5 = (char *)0x0;
        do {
          if (((cVar3 == '>') && (pcVar2[1] == ']')) && (*pcVar2 == ']')) {
            pcVar5 = pcVar2;
          }
          this->P = pcVar2 + 3;
          cVar3 = pcVar2[3];
          bVar7 = pcVar5 == (char *)0x0;
        } while ((cVar3 != '\0') && (pcVar2 = pcVar2 + 1, pcVar5 == (char *)0x0));
      }
      if (bVar7) {
        core::string<char>::operator=(&this->NodeName,"");
      }
      else {
        core::string<char>::string<char>(&local_28,c,(int)pcVar5 - (int)c);
        core::string<char>::operator=(&this->NodeName,&local_28);
        if (local_28.array != (char *)0x0) {
          operator_delete__(local_28.array);
        }
      }
    }
  }
  return cVar1 == '[';
}

Assistant:

bool parseCDATA()
	{
		if (*(P+1) != L'[')
			return false;

		CurrentNodeType = EXN_CDATA;

		// skip '<![CDATA['
		int count=0;
		while( *P && count<8 )
		{
			++P;
			++count;
		}

		if (!*P)
			return true;

		char_type *cDataBegin = P;
		char_type *cDataEnd = 0;

		// find end of CDATA
		while(*P && !cDataEnd)
		{
			if (*P == L'>' && 
			   (*(P-1) == L']') &&
			   (*(P-2) == L']'))
			{
				cDataEnd = P - 2;
			}

			++P;
		}

		if ( cDataEnd )
			NodeName = core::string<char_type>(cDataBegin, (int)(cDataEnd - cDataBegin));
		else
			NodeName = "";

		return true;
	}